

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall
cxxopts::OptionValue::parse
          (OptionValue *this,shared_ptr<const_cxxopts::OptionDetails> *details,string *text)

{
  element_type *peVar1;
  element_type *this_00;
  OptionNames *pOVar2;
  shared_ptr<const_cxxopts::OptionDetails> *in_RDX;
  OptionValue *in_RSI;
  undefined8 *in_RDI;
  
  ensure_value(in_RSI,in_RDX);
  in_RDI[3] = in_RDI[3] + 1;
  peVar1 = std::__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cxxopts::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x12d581);
  (*peVar1->_vptr_Value[3])(peVar1,in_RDX);
  this_00 = std::
            __shared_ptr_access<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_cxxopts::OptionDetails,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x12d599);
  pOVar2 = OptionDetails::long_names_abi_cxx11_(this_00);
  *in_RDI = pOVar2;
  return;
}

Assistant:

void
  parse
  (
    const std::shared_ptr<const OptionDetails>& details,
    const std::string& text
  )
  {
    ensure_value(details);
    ++m_count;
    m_value->parse(text);
    m_long_names = &details->long_names();
  }